

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

void __thiscall ICM::Compiler::PreliminaryCompile::resetNode(PreliminaryCompile *this,Node *node)

{
  pointer *ppEVar1;
  pointer pEVar2;
  iterator __position;
  Element front;
  Element local_18;
  
  pEVar2 = (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
           super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_18.field_0 = pEVar2->field_0;
  local_18._4_4_ = *(undefined4 *)&pEVar2->field_0x4;
  local_18.index = pEVar2->index;
  if ((node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
      super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar2) {
    (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
    super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar2;
  }
  __position._M_current =
       (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
       super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
      super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>::
    _M_realloc_insert<ICM::ASTBase::Element_const&>
              ((vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>> *)node,
               __position,&local_18);
  }
  else {
    (__position._M_current)->field_0 = local_18.field_0;
    *(undefined4 *)&(__position._M_current)->field_0x4 = local_18._4_4_;
    (__position._M_current)->index = local_18.index;
    ppEVar1 = &(node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
               super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  return;
}

Assistant:

void resetNode(Node &node) {
				Element front = node.front();
				node.clear();
				node.push_back(front);
			}